

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O2

ParseResults __thiscall
bubbleJson::BubbleJson::ParseLiteral
          (BubbleJson *this,BubbleValue *bubbleValue,char *expectJson,ValueTypes expectResult)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  
  Expect(this,*expectJson);
  pcVar2 = this->context->json;
  uVar4 = 0;
  do {
    lVar3 = uVar4 + 1;
    if (expectJson[lVar3] == '\0') {
      this->context->json = pcVar2 + (uVar4 & 0xffffffff);
      bubbleValue->type = expectResult;
      return ParseResult_Ok;
    }
    pcVar1 = pcVar2 + uVar4;
    uVar4 = uVar4 + 1;
  } while (*pcVar1 == expectJson[lVar3]);
  return ParseResult_InvalidValue;
}

Assistant:

ParseResults BubbleJson::ParseLiteral(BubbleValue *bubbleValue, const char *expectJson, ValueTypes expectResult)
{
    Expect(expectJson[0]);

    const char *json = this->context->json;
    int i;
    //因为Expect里面json会自加1，所以json比expectJson快进一个字符
    for (i = 0; expectJson[i + 1]; i++)
    {
        if (json[i] != expectJson[i + 1])
            return ParseResult_InvalidValue;
    }
    this->context->json += i;
    bubbleValue->type = expectResult;
    return ParseResult_Ok;
}